

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

nifti_image * nifti_read_ascii_image(znzFile fp,char *fname,int flen,int read_data)

{
  int iVar1;
  char *pcVar2;
  nifti_image *nim;
  int txt_size;
  char lfunc [25];
  znzFile local_58;
  int local_4c;
  char local_48 [32];
  
  builtin_strncpy(local_48 + 0x10,"_image",7);
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  builtin_strncpy(local_48,"nifti_read_ascii",0x10);
  local_58 = fp;
  iVar1 = nifti_is_gzfile(fname);
  if (iVar1 == 0) {
    if (1 < g_opts_0) {
      fprintf(_stderr,"-d %s: have ASCII NIFTI file of size %d\n",fname,(ulong)(uint)flen);
    }
    iVar1 = 0xfffa;
    if (flen < 0xfffa) {
      iVar1 = flen;
    }
    pcVar2 = (char *)calloc(1,(long)(iVar1 + 1));
    if (pcVar2 == (char *)0x0) {
      fprintf(_stderr,"** %s: failed to alloc %d bytes for sbuf",local_48,0xfffa);
      goto LAB_0010ffe2;
    }
    znzread(pcVar2,1,(long)iVar1,local_58);
    nim = nifti_image_from_ascii(pcVar2,&local_4c);
    free(pcVar2);
    if (nim != (nifti_image *)0x0) {
      nim->nifti_type = 3;
      iVar1 = flen - (nim->nbyper * (int)nim->nvox + local_4c);
      if (4 < iVar1) {
        znzseek(local_58,(long)local_4c,0);
        nifti_read_extensions(nim,local_58,iVar1);
      }
      free(fname);
      Xznzclose(&local_58);
      nim->iname_offset = -1;
      if (read_data != 0) {
        iVar1 = nifti_image_load(nim);
        if (iVar1 == 0) {
          return nim;
        }
        if (1 < g_opts_0) {
          nifti_read_ascii_image_cold_1();
        }
        free(nim);
        return (nifti_image *)0x0;
      }
      nim->data = (void *)0x0;
      return nim;
    }
    pcVar2 = "failed nifti_image_from_ascii()";
  }
  else {
    pcVar2 = "compression not supported for file type NIFTI_FTYPE_ASCII";
  }
  fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_48,pcVar2,fname);
LAB_0010ffe2:
  free(fname);
  Xznzclose(&local_58);
  return (nifti_image *)0x0;
}

Assistant:

nifti_image * nifti_read_ascii_image(znzFile fp, char *fname, int flen,
                                     int read_data)
{
   nifti_image * nim;
   int           slen, txt_size, remain, rv = 0;
   char        * sbuf, lfunc[25] = { "nifti_read_ascii_image" };

   if( nifti_is_gzfile(fname) ){
     LNI_FERR(lfunc,"compression not supported for file type NIFTI_FTYPE_ASCII",
              fname);
     free(fname);  znzclose(fp);  return NULL;
   }
   slen = flen;  /* slen will be our buffer length */

   if( g_opts.debug > 1 )
      fprintf(stderr,"-d %s: have ASCII NIFTI file of size %d\n",fname,slen);

   if( slen > 65530 ) slen = 65530 ;
   sbuf = (char *)calloc(sizeof(char),slen+1) ;
   if( !sbuf ){
      fprintf(stderr,"** %s: failed to alloc %d bytes for sbuf",lfunc,65530);
      free(fname);  znzclose(fp);  return NULL;
   }
   znzread( sbuf , 1 , slen , fp ) ;
   nim = nifti_image_from_ascii( sbuf, &txt_size ) ; free( sbuf ) ;
   if( nim == NULL ){
      LNI_FERR(lfunc,"failed nifti_image_from_ascii()",fname);
      free(fname);  znzclose(fp);  return NULL;
   }
   nim->nifti_type = NIFTI_FTYPE_ASCII ;

   /* compute remaining space for extensions */
   remain = flen - txt_size - (int)nifti_get_volsize(nim);
   if( remain > 4 ){
      /* read extensions (reposition file pointer, first) */
      znzseek(fp, txt_size, SEEK_SET);
      (void) nifti_read_extensions(nim, fp, remain);
   }

   free(fname);
   znzclose( fp ) ;

   nim->iname_offset = -1 ;  /* check from the end of the file */

   if( read_data ) rv = nifti_image_load( nim ) ;
   else            nim->data = NULL ;

   /* check for nifti_image_load() failure, maybe bail out */
   if( read_data && rv != 0 ){
      if( g_opts.debug > 1 )
         fprintf(stderr,"-d failed image_load, free nifti image struct\n");
      free(nim);
      return NULL;
   }

   return nim ;
}